

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_ghost_real(REF_NODE ref_node)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_NODE ref_node_local;
  
  ref_node_local._4_4_ = ref_node_ghost_dbl(ref_node,ref_node->real,0xf);
  if (ref_node_local._4_4_ == 0) {
    if ((ref_node->naux < 1) ||
       (ref_node_local._4_4_ = ref_node_ghost_dbl(ref_node,ref_node->aux,ref_node->naux),
       ref_node_local._4_4_ == 0)) {
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x387,
             "ref_node_ghost_real",(ulong)ref_node_local._4_4_,"ghost dbl");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",900,
           "ref_node_ghost_real",(ulong)ref_node_local._4_4_,"ghost dbl");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_real(REF_NODE ref_node) {
  RSS(ref_node_ghost_dbl(ref_node, ref_node->real, REF_NODE_REAL_PER),
      "ghost dbl");
  if (ref_node_naux(ref_node) > 0)
    RSS(ref_node_ghost_dbl(ref_node, ref_node->aux, ref_node_naux(ref_node)),
        "ghost dbl");
  return REF_SUCCESS;
}